

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  char cVar1;
  char cVar2;
  char cVar3;
  pointer pcVar4;
  size_type sVar5;
  char *pcVar6;
  pointer pbVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  long lVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  long *plVar13;
  _Alloc_hider _Var14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  string value;
  string delims;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  value_type local_f8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long *local_90;
  char *local_88;
  long local_80;
  long lStack_78;
  pointer local_70;
  ulong local_68;
  char local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_d8[0] = local_c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"\'\"`","");
  local_70 = (str->_M_dataplus)._M_p;
  local_f8._M_dataplus._M_p = local_70 + str->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_b8);
  str->_M_string_length = (long)local_b8 - (long)(str->_M_dataplus)._M_p;
  *local_b8 = 0;
  _Var8 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar4 = (str->_M_dataplus)._M_p;
  if (pcVar4 + str->_M_string_length == _Var8._M_current) {
    str->_M_string_length = 0;
    *pcVar4 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)str,0);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar5 = str->_M_string_length;
  do {
    if (sVar5 == 0) {
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
      return __return_storage_ptr__;
    }
    lVar9 = ::std::__cxx11::string::find((char)local_d8,(ulong)(uint)(int)*(str->_M_dataplus)._M_p);
    pcVar6 = (str->_M_dataplus)._M_p;
    if (lVar9 == -1) {
      _Var8 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string)::_lambda(char)_1_>>
                        (pcVar6,pcVar6 + str->_M_string_length);
      pcVar4 = (str->_M_dataplus)._M_p;
      if (_Var8._M_current == pcVar4 + str->_M_string_length) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,str);
        ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x15c15b);
      }
      else {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&local_f8,pcVar4,_Var8._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_f8);
        local_70 = local_60;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&local_70,_Var8._M_current,
                   (str->_M_dataplus)._M_p + str->_M_string_length);
        ::std::__cxx11::string::operator=((string *)str,(string *)&local_70);
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        _Var14._M_p = local_f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_0014fe22:
          operator_delete(_Var14._M_p);
        }
      }
    }
    else {
      cVar1 = *pcVar6;
      lVar9 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
      if (lVar9 == -1) {
LAB_0014faf1:
        ::std::__cxx11::string::substr((ulong)&local_f8,(ulong)str);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x15c15b);
        if (lVar9 != -1) {
LAB_0014fbf5:
          pbVar7 = (__return_storage_ptr__->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pcVar4 = pbVar7[-1]._M_dataplus._M_p;
          local_b0 = &local_a0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar4,pcVar4 + pbVar7[-1]._M_string_length);
          local_70 = local_60;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\\","");
          plVar11 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_70,local_68,0,'\x01');
          local_90 = &local_80;
          plVar13 = plVar11 + 2;
          if ((long *)*plVar11 == plVar13) {
            local_80 = *plVar13;
            lStack_78 = plVar11[3];
          }
          else {
            local_80 = *plVar13;
            local_90 = (long *)*plVar11;
          }
          local_88 = (char *)plVar11[1];
          *plVar11 = (long)plVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_50 = local_40;
          ::std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
          uVar12 = ::std::__cxx11::string::find((char *)&local_b0,(ulong)local_90,0);
          sVar5 = local_a8;
          while (uVar12 != 0xffffffffffffffff) {
            local_a8 = sVar5;
            ::std::__cxx11::string::replace((ulong)&local_b0,uVar12,local_88,(ulong)local_50);
            uVar12 = ::std::__cxx11::string::find
                               ((char *)&local_b0,(ulong)local_90,uVar12 + local_48);
            sVar5 = local_a8;
          }
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          if (local_b0 != &local_a0) {
            local_f8._M_dataplus._M_p = (pointer)local_b0;
          }
          local_f8.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
          local_f8.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
          local_a8 = 0;
          local_a0._M_local_buf[0] = '\0';
          local_f8._M_string_length = sVar5;
          local_b0 = &local_a0;
          ::std::__cxx11::string::operator=
                    ((string *)
                     ((__return_storage_ptr__->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1),(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if (local_50 != local_40) {
            operator_delete(local_50);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90);
          }
          if (local_70 != local_60) {
            operator_delete(local_70);
          }
          _Var14._M_p = (pointer)local_b0;
          if (local_b0 != &local_a0) goto LAB_0014fe22;
        }
      }
      else {
        cVar2 = (str->_M_dataplus)._M_p[lVar9 + -1];
        cVar3 = cVar2;
        while (cVar3 == '\\') {
          lVar10 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
          if (lVar10 == -1) goto LAB_0014faf1;
          cVar3 = (str->_M_dataplus)._M_p[lVar10 + -1];
        }
        ::std::__cxx11::string::substr((ulong)&local_f8,(ulong)str);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        ::std::__cxx11::string::substr((ulong)&local_f8,(ulong)str);
        ::std::__cxx11::string::operator=((string *)str,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if (cVar2 == '\\') goto LAB_0014fbf5;
      }
    }
    local_70 = (str->_M_dataplus)._M_p;
    local_f8._M_dataplus._M_p = local_70 + str->_M_string_length;
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (&local_b8,&local_f8,&local_70);
    str->_M_string_length = (long)local_b8 - (long)(str->_M_dataplus)._M_p;
    *local_b8 = 0;
    _Var8 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                      ();
    pcVar4 = (str->_M_dataplus)._M_p;
    if (pcVar4 + str->_M_string_length == _Var8._M_current) {
      str->_M_string_length = 0;
      *pcVar4 = '\0';
    }
    else {
      ::std::__cxx11::string::_M_erase((ulong)str,0);
    }
    sVar5 = str->_M_string_length;
  } while( true );
}

Assistant:

inline std::vector<std::string> split_up(std::string str) {

    const std::string delims("\'\"`");
    auto find_ws = [](char ch) { return std::isspace<char>(ch, std::locale()); };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) { // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}